

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcDrawElementsBaseVertexTests.cpp
# Opt level: O3

void __thiscall
glcts::DrawElementsBaseVertexFunctionalCorrectBaseVertexBehavior::setUpTestCases
          (DrawElementsBaseVertexFunctionalCorrectBaseVertexBehavior *this)

{
  pointer *pp_Var1;
  GLuint *pGVar2;
  bool use_clientside_index_data;
  bool bVar3;
  bool bVar4;
  _function_type _Var5;
  bool bVar6;
  bool bVar7;
  uint uVar8;
  GLuint GVar9;
  GLuint GVar10;
  long lVar11;
  bool bVar12;
  _test_case *p_Var13;
  iterator __position;
  long lVar14;
  GLuint *current_index_offset;
  GLuint *pGVar15;
  byte bVar16;
  _function_type local_100;
  _test_case local_a8;
  
  bVar16 = 0;
  use_clientside_index_data = false;
  bVar12 = true;
  do {
    uVar8 = (*((this->super_DrawElementsBaseVertexTestBase).super_TestCaseBase.m_context)->
              m_renderCtx->_vptr_RenderContext[2])();
    if ((use_clientside_index_data) && ((uVar8 & 0x300) != 0)) {
      return;
    }
    DrawElementsBaseVertexTestBase::computeVBODataOffsets
              (&this->super_DrawElementsBaseVertexTestBase,use_clientside_index_data,false);
    pGVar2 = (this->super_DrawElementsBaseVertexTestBase).m_draw_call_index2_offset;
    pGVar15 = (this->super_DrawElementsBaseVertexTestBase).m_draw_call_index_offset;
    bVar6 = true;
    do {
      bVar4 = bVar6;
      local_100 = FUNCTION_GL_DRAW_ELEMENTS_BASE_VERTEX;
      GVar9 = 10;
      if (bVar4) {
        GVar9 = 0;
      }
      GVar10 = 0x20;
      if (bVar4) {
        GVar10 = 0x16;
      }
      do {
        if ((local_100 == FUNCTION_GL_MULTI_DRAW_ELEMENTS_BASE_VERTEX) &&
           ((this->super_DrawElementsBaseVertexTestBase).m_is_ext_multi_draw_arrays_supported ==
            false)) break;
        lVar14 = 0;
        bVar6 = true;
        do {
          bVar7 = bVar6;
          lVar11 = 0;
          bVar6 = true;
          do {
            bVar3 = bVar6;
            if (((this->super_DrawElementsBaseVertexTestBase).m_is_vertex_attrib_binding_supported
                 != false) || ((&DAT_01b200f0)[lVar11] == '\0')) {
              local_a8.regular_draw_call_index_type = 0;
              local_a8.regular_draw_call_offset2 = (GLuint *)0x0;
              local_a8.use_tessellation_shader_stage = false;
              local_a8.use_overflow_test_vertices = false;
              local_a8.use_clientside_vertex_data = false;
              local_a8.basevertex = (&DAT_01b21db0)[lVar14];
              local_a8.function_type = local_100;
              local_a8.index_offset = pGVar15;
              local_a8.range_start = GVar9;
              local_a8.range_end = GVar10;
              local_a8.index_type = 0x1405;
              local_a8.primitive_mode = 4;
              local_a8.regular_draw_call_offset = 10;
              local_a8.should_base_texture_match_reference_texture = (bool)((byte)lVar14 ^ 1);
              local_a8.use_clientside_index_data = use_clientside_index_data;
              local_a8.use_geometry_shader_stage = false;
              local_a8.use_vertex_attrib_binding = (bool)(&DAT_01b200f0)[lVar11];
              local_a8.multi_draw_call_count_array[0] = 3;
              local_a8.multi_draw_call_count_array[1] = 6;
              local_a8.multi_draw_call_count_array[2] = 3;
              local_a8.multi_draw_call_indices_array[0] = pGVar15;
              local_a8.multi_draw_call_indices_array[1] = pGVar15 + 3;
              local_a8.multi_draw_call_indices_array[2] = pGVar15 + 9;
              local_a8.regular_multi_draw_call_offseted_array[0] = (GLuint **)(pGVar15 + 10);
              local_a8.regular_multi_draw_call_offseted_array[1] = (GLuint **)(pGVar15 + 0xd);
              local_a8.regular_multi_draw_call_offseted_array[2] = (GLuint **)(pGVar15 + 0x13);
              __position._M_current =
                   (this->super_DrawElementsBaseVertexTestBase).m_test_cases.
                   super__Vector_base<glcts::DrawElementsBaseVertexTestBase::_test_case,_std::allocator<glcts::DrawElementsBaseVertexTestBase::_test_case>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              if (__position._M_current ==
                  (this->super_DrawElementsBaseVertexTestBase).m_test_cases.
                  super__Vector_base<glcts::DrawElementsBaseVertexTestBase::_test_case,_std::allocator<glcts::DrawElementsBaseVertexTestBase::_test_case>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::
                vector<glcts::DrawElementsBaseVertexTestBase::_test_case,std::allocator<glcts::DrawElementsBaseVertexTestBase::_test_case>>
                ::_M_realloc_insert<glcts::DrawElementsBaseVertexTestBase::_test_case_const&>
                          ((vector<glcts::DrawElementsBaseVertexTestBase::_test_case,std::allocator<glcts::DrawElementsBaseVertexTestBase::_test_case>>
                            *)&(this->super_DrawElementsBaseVertexTestBase).m_test_cases,__position,
                           &local_a8);
              }
              else {
                p_Var13 = &local_a8;
                for (lVar11 = 0xf; lVar11 != 0; lVar11 = lVar11 + -1) {
                  _Var5 = p_Var13->function_type;
                  (__position._M_current)->basevertex = p_Var13->basevertex;
                  (__position._M_current)->function_type = _Var5;
                  p_Var13 = (_test_case *)((long)p_Var13 + ((ulong)bVar16 * -2 + 1) * 8);
                  __position._M_current = __position._M_current + (ulong)bVar16 * -0x10 + 8;
                }
                pp_Var1 = &(this->super_DrawElementsBaseVertexTestBase).m_test_cases.
                           super__Vector_base<glcts::DrawElementsBaseVertexTestBase::_test_case,_std::allocator<glcts::DrawElementsBaseVertexTestBase::_test_case>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                *pp_Var1 = *pp_Var1 + 1;
              }
            }
            lVar11 = 1;
            bVar6 = false;
          } while (bVar3);
          lVar14 = 1;
          bVar6 = false;
        } while (bVar7);
        local_100 = local_100 + FUNCTION_GL_DRAW_ELEMENTS_INSTANCED_BASE_VERTEX;
      } while (local_100 != FUNCTION_COUNT);
      pGVar15 = pGVar2;
      bVar6 = false;
    } while (bVar4);
    use_clientside_index_data = true;
    bVar6 = !bVar12;
    bVar12 = false;
    if (bVar6) {
      return;
    }
  } while( true );
}

Assistant:

void DrawElementsBaseVertexFunctionalCorrectBaseVertexBehavior::setUpTestCases()
{
	/* Set up test case descriptors */
	const glw::GLint   basevertex_values[] = { 10, 0 };
	const unsigned int n_basevertex_values = sizeof(basevertex_values) / sizeof(basevertex_values[0]);

	/* The test needs to be run in two iterations, using client-side memory and buffer object
	 * for index data respectively
	 */
	for (int vao_iteration = 0; vao_iteration < 2; ++vao_iteration)
	{
		/* Skip client-side vertex array as gl_VertexID is undefined when no buffer bound to ARRAY_BUFFER
		 *  See section 11.1.3.9 in OpenGL ES 3.1 spec
		 */
		bool use_clientside_vertex_data = 0;
		bool use_clientside_index_data  = ((vao_iteration & (1 << 0)) != 0);

		/* OpenGL does not support client-side data. */
		if (!glu::isContextTypeES(m_context.getRenderContext().getType()))
		{
			if (use_clientside_index_data || use_clientside_vertex_data)
			{
				continue;
			}
		}

		/* Compute the offsets */
		computeVBODataOffsets(use_clientside_index_data, use_clientside_vertex_data);

		/* There are two index data sets we need to iterate over */
		const glw::GLuint* index_offsets[] = { m_draw_call_index_offset, m_draw_call_index2_offset };
		const unsigned int n_index_offsets = sizeof(index_offsets) / sizeof(index_offsets[0]);

		for (unsigned int n_index_offset = 0; n_index_offset < n_index_offsets; ++n_index_offset)
		{
			const glw::GLuint* current_index_offset = index_offsets[n_index_offset];

			/* We need to test four different functions:
			 *
			 * a)    glDrawElementsBaseVertex()             (GL)
			 *    or glDrawElementsBaseVertexEXT()          (ES)
			 * b)    glDrawRangeElementsBaseVertex()        (GL)
			 *    or glDrawRangeElementsBaseVertexEXT()     (ES)
			 * c)    glDrawElementsInstancedBaseVertex()    (GL)
			 *    or glDrawElementsInstancedBaseVertexEXT() (ES)
			 * d)    glMultiDrawElementsBaseVertex()        (GL)
			 *    or glMultiDrawElementsBaseVertexEXT()     (ES) (if supported)
			 **/
			for (int n_function = 0; n_function < FUNCTION_COUNT; ++n_function)
			{
				/* Do not try to use the multi draw call if relevant extension is
				 * not supported. */
				if (!m_is_ext_multi_draw_arrays_supported && n_function == FUNCTION_GL_MULTI_DRAW_ELEMENTS_BASE_VERTEX)
				{
					continue;
				}

				/* We need to run the test for a number of different basevertex values. */
				for (unsigned int n_basevertex_value = 0; n_basevertex_value < n_basevertex_values;
					 ++n_basevertex_value)
				{
					/* Finally, we want to verify that basevertex draw calls work correctly both when vertex attribute
					 * bindings are enabled and disabled */
					bool		 vertex_attrib_binding_statuses[] = { false, true };
					unsigned int n_vertex_attrib_binding_statuses =
						sizeof(vertex_attrib_binding_statuses) / sizeof(vertex_attrib_binding_statuses[0]);

					for (unsigned int n_vertex_attrib_binding_status = 0;
						 n_vertex_attrib_binding_status < n_vertex_attrib_binding_statuses;
						 ++n_vertex_attrib_binding_status)
					{
						bool use_vertex_attrib_binding = vertex_attrib_binding_statuses[n_vertex_attrib_binding_status];

						/* Under GL, "vertex attrib binding" functionality is only available if GL_ARB_vertex_attrib_binding
						 * extension is supported.
						 */
						if (!m_is_vertex_attrib_binding_supported && use_vertex_attrib_binding)
						{
							continue;
						}

						/* Prepare a few arrays so that we can handle the multi draw call and its emulated version.. */
						const glw::GLsizei multi_draw_call_count_array[3]   = { 3, 6, 3 };
						const glw::GLuint* multi_draw_call_indices_array[3] = {
							(glw::GLuint*)(current_index_offset), (glw::GLuint*)(current_index_offset + 3),
							(glw::GLuint*)(current_index_offset + 9)
						};

						/* Reference texture should always reflect basevertex=10 behavior. */
						const glw::GLuint  regular_draw_call_offset					 = basevertex_values[0];
						const glw::GLuint* regular_multi_draw_call_offseted_array[3] = {
							multi_draw_call_indices_array[0] + regular_draw_call_offset,
							multi_draw_call_indices_array[1] + regular_draw_call_offset,
							multi_draw_call_indices_array[2] + regular_draw_call_offset,
						};

						/* Construct the test case descriptor */
						_test_case new_test_case;

						new_test_case.basevertex			   = basevertex_values[n_basevertex_value];
						new_test_case.function_type			   = (_function_type)n_function;
						new_test_case.index_offset			   = current_index_offset;
						new_test_case.range_start			   = n_index_offset == 0 ? 0 : 10;
						new_test_case.range_end				   = n_index_offset == 0 ? 22 : 32;
						new_test_case.index_type			   = GL_UNSIGNED_INT;
						new_test_case.primitive_mode		   = GL_TRIANGLES;
						new_test_case.regular_draw_call_offset = basevertex_values[0];
						new_test_case.should_base_texture_match_reference_texture =
							((glw::GLuint)new_test_case.basevertex == new_test_case.regular_draw_call_offset);
						new_test_case.use_clientside_index_data		= use_clientside_index_data;
						new_test_case.use_clientside_vertex_data	= use_clientside_vertex_data;
						new_test_case.use_geometry_shader_stage		= false;
						new_test_case.use_tessellation_shader_stage = false;
						new_test_case.use_vertex_attrib_binding		= use_vertex_attrib_binding;

						memcpy(new_test_case.multi_draw_call_count_array, multi_draw_call_count_array,
							   sizeof(multi_draw_call_count_array));
						memcpy(new_test_case.multi_draw_call_indices_array, multi_draw_call_indices_array,
							   sizeof(multi_draw_call_indices_array));
						memcpy(new_test_case.regular_multi_draw_call_offseted_array,
							   regular_multi_draw_call_offseted_array, sizeof(regular_multi_draw_call_offseted_array));

						m_test_cases.push_back(new_test_case);
					} /* for (all vertex_attrib_binding statuses) */
				}	 /* for (all basevertex values) */
			}		  /* for (all four functions) */
		}			  /* for (all index data sets) */
	}				  /* for (all VAO iterations) */
}